

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::TanH_x86_fma::forward_inplace(TanH_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [24];
  undefined1 auVar42 [16];
  long *in_RSI;
  float fVar44;
  float fVar45;
  undefined1 auVar43 [32];
  undefined1 auVar46 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one;
  __m128 two_1;
  __m128 one_3;
  __m256 one_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_2;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 one_4;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_5;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  int local_14d8;
  undefined8 local_14c8;
  undefined8 local_14c0;
  undefined8 local_14b8;
  undefined4 local_14b0;
  long local_14a8;
  undefined4 local_14a0;
  undefined4 local_149c;
  undefined4 local_1498;
  undefined4 local_1494;
  undefined4 local_1490;
  undefined8 local_1488;
  undefined1 (*local_1480) [32];
  int local_1474;
  int local_1470;
  int local_146c;
  int local_1468;
  int local_1464;
  int local_1460;
  int local_145c;
  long *local_1450;
  undefined1 local_143d;
  int local_143c;
  undefined8 *local_1430;
  undefined8 *local_1428;
  undefined8 *local_1418;
  undefined1 (*local_1408) [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 (*local_1370) [32];
  undefined1 (*local_1368) [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined1 (*local_1320) [32];
  long local_1318;
  undefined4 local_130c;
  long local_1308;
  undefined1 (*local_1300) [32];
  undefined4 local_12f4;
  int local_12f0;
  int local_12ec;
  undefined8 *local_12e8;
  undefined4 local_12dc;
  long local_12d8;
  undefined8 *local_12b8;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  undefined4 uStack_11e4;
  undefined4 local_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [16];
  undefined1 auStack_1170 [16];
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  undefined4 local_1150;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 local_1144;
  undefined1 local_1140 [16];
  undefined1 auStack_1130 [16];
  undefined4 local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  undefined4 local_1114;
  undefined4 local_1110;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined1 local_1100 [16];
  undefined1 auStack_10f0 [16];
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [8];
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined1 local_f80 [8];
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [32];
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  ulong uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined1 *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  float *local_d10;
  undefined1 *local_d08;
  undefined1 *local_d00;
  float *local_cf8;
  undefined1 *local_cf0;
  undefined1 *local_ce8;
  float *local_ce0;
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  float *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  float *local_cb0;
  undefined1 *local_ca8;
  undefined1 *local_ca0;
  float *local_c98;
  float *local_c90;
  undefined1 *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 *local_c30;
  float *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  float *local_c10;
  undefined1 *local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined4 local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  float local_9e0 [2];
  float afStack_9d8 [2];
  float afStack_9d0 [2];
  float afStack_9c8 [2];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940 [2];
  float afStack_938 [2];
  float afStack_930 [2];
  float afStack_928 [2];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0 [2];
  float afStack_8d8 [2];
  float afStack_8d0 [2];
  float afStack_8c8 [2];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float local_880 [2];
  float afStack_878 [2];
  float afStack_870 [2];
  float afStack_868 [2];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820 [2];
  float afStack_818 [2];
  float afStack_810 [2];
  float afStack_808 [2];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740 [2];
  float afStack_738 [2];
  float afStack_730 [2];
  float afStack_728 [2];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0 [2];
  float afStack_6d8 [2];
  float afStack_6d0 [2];
  float afStack_6c8 [2];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined4 local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined4 local_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  undefined4 local_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined4 local_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  ulong uStack_518;
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  float *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  float *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  float *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  float *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  float *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  float *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  float *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  float local_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  float local_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_145c = *(int *)((long)in_RSI + 0x2c);
  local_1460 = (int)in_RSI[6];
  local_1464 = *(int *)((long)in_RSI + 0x34);
  local_1468 = (int)in_RSI[7];
  local_146c = (int)in_RSI[3];
  local_1470 = local_145c * local_1460 * local_1464 * local_146c;
  local_1450 = in_RSI;
  for (local_1474 = 0; local_1474 < local_1468; local_1474 = local_1474 + 1) {
    local_1430 = &local_14c8;
    local_12ec = *(int *)((long)local_1450 + 0x2c);
    local_12f0 = (int)local_1450[6];
    local_12f4 = *(undefined4 *)((long)local_1450 + 0x34);
    local_1300 = (undefined1 (*) [32])
                 (*local_1450 + local_1450[8] * (long)local_1474 * local_1450[2]);
    local_1308 = local_1450[2];
    local_130c = (undefined4)local_1450[3];
    local_1318 = local_1450[4];
    local_12e8 = &local_14c8;
    local_12d8 = (long)local_12ec * (long)local_12f0 * local_1308;
    local_1428 = &local_14c8;
    local_1418 = &local_14c8;
    local_12dc = 0x10;
    local_143c = local_1474;
    local_143d = 1;
    local_14c8 = 0;
    local_14b8 = 0;
    local_14b0 = 0;
    local_14a0 = 0;
    local_149c = 0;
    local_1498 = 0;
    local_1494 = 0;
    local_1490 = 0;
    local_1488 = 0;
    local_14c0 = 0;
    local_1480 = local_1300;
    for (local_14d8 = 0; local_14d8 + 7 < local_1470; local_14d8 = local_14d8 + 8) {
      local_1408 = local_1480;
      auVar41 = *(undefined1 (*) [24])*local_1480;
      uStack_13a8 = *(undefined8 *)(*local_1480 + 0x18);
      local_1500 = auVar41._0_8_;
      local_13c0 = local_1500;
      uStack_14f8 = auVar41._8_8_;
      uStack_13b8 = uStack_14f8;
      uStack_14f0 = auVar41._16_8_;
      uStack_13b0 = uStack_14f0;
      local_1284 = 0x3f800000;
      local_1120 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1140 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_1130 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_13e0 = local_1140._0_8_;
      uStack_13d8 = local_1140._8_8_;
      uStack_13d0 = auStack_1130._0_8_;
      uStack_13c8 = auStack_1130._8_8_;
      local_1288 = 0x40000000;
      local_10e0 = 0x40000000;
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      local_1100 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
      auStack_10f0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
      local_1400 = local_1100._0_8_;
      uStack_13f8 = local_1100._8_8_;
      uStack_13f0 = auStack_10f0._0_8_;
      uStack_13e8 = auStack_10f0._8_8_;
      uVar7 = local_1500;
      uVar8 = uStack_14f8;
      local_11a0._0_4_ = auVar41._0_4_;
      local_11a0._4_4_ = auVar41._4_4_;
      uStack_1198._0_4_ = auVar41._8_4_;
      uStack_1198._4_4_ = auVar41._12_4_;
      uStack_1190._0_4_ = auVar41._16_4_;
      uStack_1190._4_4_ = auVar41._20_4_;
      uStack_1188._0_4_ = (float)uStack_13a8;
      uStack_1188._4_4_ = (undefined4)((ulong)uStack_13a8 >> 0x20);
      uStack_11e4 = uStack_1188._4_4_;
      local_11c0._0_4_ = local_1100._0_4_;
      local_11c0._4_4_ = local_1100._4_4_;
      uStack_11b8._0_4_ = local_1100._8_4_;
      uStack_11b8._4_4_ = local_1100._12_4_;
      uStack_11b0._0_4_ = auStack_10f0._0_4_;
      uStack_11b0._4_4_ = auStack_10f0._4_4_;
      uStack_11a8._0_4_ = auStack_10f0._8_4_;
      local_1200 = (float)local_11a0 * (float)local_11c0;
      fStack_11fc = local_11a0._4_4_ * local_11c0._4_4_;
      fStack_11f8 = (float)uStack_1198 * (float)uStack_11b8;
      fStack_11f4 = uStack_1198._4_4_ * uStack_11b8._4_4_;
      fStack_11f0 = (float)uStack_1190 * (float)uStack_11b0;
      fStack_11ec = uStack_1190._4_4_ * uStack_11b0._4_4_;
      fStack_11e8 = (float)uStack_1188 * (float)uStack_11a8;
      local_11c4 = 0x3f800000;
      local_1160 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_1180 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_1170 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1220 = local_1180._0_8_;
      uStack_1218 = local_1180._8_8_;
      uStack_1210 = auStack_1170._0_8_;
      uStack_1208 = auStack_1170._8_8_;
      local_10a0 = local_1180._0_8_;
      uStack_1098 = local_1180._8_8_;
      uStack_1090 = auStack_1170._0_8_;
      uStack_1088 = auStack_1170._8_8_;
      local_e00 = ZEXT832(0) << 0x20;
      local_e20 = 0;
      local_de0._8_8_ = SUB328(ZEXT832(0),4);
      uStack_e18 = local_de0._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = CONCAT44(fStack_11fc,local_1200);
      uStack_e38 = CONCAT44(fStack_11f4,fStack_11f8);
      uStack_e30 = CONCAT44(fStack_11ec,fStack_11f0);
      uStack_e28 = CONCAT44(uStack_1188._4_4_,fStack_11e8);
      auVar11._8_8_ = uStack_e38;
      auVar11._0_8_ = local_e40;
      auVar11._16_8_ = uStack_e30;
      auVar11._24_8_ = uStack_e28;
      auVar6 = vsubps_avx(ZEXT832((ulong)local_de0._8_8_) << 0x40,auVar11);
      local_fe0 = 0x3f8000003f800000;
      uStack_fd8 = 0x3f8000003f800000;
      uStack_fd0 = 0x3f8000003f800000;
      uStack_fc8 = 0x3f8000003f800000;
      local_f60._0_8_ = auVar6._0_8_;
      local_da0 = local_f60._0_8_;
      local_f60._8_8_ = auVar6._8_8_;
      uStack_d98 = local_f60._8_8_;
      local_f60._16_8_ = auVar6._16_8_;
      uStack_d90 = local_f60._16_8_;
      local_f60._24_8_ = auVar6._24_8_;
      uStack_d88 = local_f60._24_8_;
      local_dc0 = 0x42b0c0a542b0c0a5;
      uStack_db8 = 0x42b0c0a542b0c0a5;
      uStack_db0 = 0x42b0c0a542b0c0a5;
      uStack_da8 = 0x42b0c0a542b0c0a5;
      auVar12._8_8_ = 0x42b0c0a542b0c0a5;
      auVar12._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12._16_8_ = 0x42b0c0a542b0c0a5;
      auVar12._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar12);
      local_f60._0_8_ = auVar6._0_8_;
      local_d60 = local_f60._0_8_;
      local_f60._8_8_ = auVar6._8_8_;
      uStack_d58 = local_f60._8_8_;
      local_f60._16_8_ = auVar6._16_8_;
      uStack_d50 = local_f60._16_8_;
      local_f60._24_8_ = auVar6._24_8_;
      uStack_d48 = local_f60._24_8_;
      local_d80 = 0xc2b0c0a5c2b0c0a5;
      uStack_d78 = 0xc2b0c0a5c2b0c0a5;
      uStack_d70 = 0xc2b0c0a5c2b0c0a5;
      uStack_d68 = 0xc2b0c0a5c2b0c0a5;
      auVar43._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar6,auVar43);
      local_d28 = local_f60;
      local_c90 = ::_ps256_cephes_LOG2EF;
      local_c98 = ::_ps256_0p5;
      local_f60._0_8_ = auVar4._0_8_;
      local_9c0 = local_f60._0_8_;
      local_f60._8_8_ = auVar4._8_8_;
      uStack_9b8 = local_f60._8_8_;
      local_f60._16_8_ = auVar4._16_8_;
      uStack_9b0 = local_f60._16_8_;
      local_f60._24_8_ = auVar4._24_8_;
      uStack_9a8 = local_f60._24_8_;
      local_9e0[0] = 1.442695;
      local_9e0[1] = 1.442695;
      afStack_9d8[0] = 1.442695;
      afStack_9d8[1] = 1.442695;
      afStack_9d0[0] = 1.442695;
      afStack_9d0[1] = 1.442695;
      afStack_9c8[0] = 1.442695;
      afStack_9c8[1] = 1.442695;
      local_a00[0] = 0.5;
      local_a00[1] = 0.5;
      afStack_9f8[0] = 0.5;
      afStack_9f8[1] = 0.5;
      afStack_9f0[0] = 0.5;
      afStack_9f0[1] = 0.5;
      afStack_9e8[0] = 0.5;
      afStack_9e8[1] = 0.5;
      auVar15._8_4_ = 1.442695;
      auVar15._12_4_ = 1.442695;
      auVar15._0_4_ = 1.442695;
      auVar15._4_4_ = 1.442695;
      auVar15._16_4_ = 1.442695;
      auVar15._20_4_ = 1.442695;
      auVar15._24_4_ = 1.442695;
      auVar15._28_4_ = 1.442695;
      auVar14._8_4_ = 0.5;
      auVar14._12_4_ = 0.5;
      auVar14._0_4_ = 0.5;
      auVar14._4_4_ = 0.5;
      auVar14._16_4_ = 0.5;
      auVar14._20_4_ = 0.5;
      auVar14._24_4_ = 0.5;
      auVar14._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar15,auVar4,auVar14);
      auVar5 = vroundps_avx(ZEXT1632(auVar2),1);
      auVar6 = vcmpps_avx(ZEXT1632(auVar2),auVar5,1);
      local_1000._0_8_ = auVar6._0_8_;
      local_c60 = local_1000._0_8_;
      local_1000._8_8_ = auVar6._8_8_;
      uStack_c58 = local_1000._8_8_;
      local_1000._16_8_ = auVar6._16_8_;
      uStack_c50 = local_1000._16_8_;
      local_1000._24_8_ = auVar6._24_8_;
      uStack_c48 = local_1000._24_8_;
      local_c80 = 0x3f8000003f800000;
      uStack_c78 = 0x3f8000003f800000;
      uStack_c70 = 0x3f8000003f800000;
      uStack_c68 = 0x3f8000003f800000;
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._16_8_ = 0x3f8000003f800000;
      auVar13._24_8_ = 0x3f8000003f800000;
      local_1000 = vandps_avx(auVar6,auVar13);
      local_f80 = auVar5._0_8_;
      local_e60 = local_f80;
      uStack_f78 = auVar5._8_8_;
      uStack_e58 = uStack_f78;
      uStack_f70 = auVar5._16_8_;
      uStack_e50 = uStack_f70;
      uStack_f68 = auVar5._24_8_;
      uStack_e48 = uStack_f68;
      local_e80 = local_1000._0_8_;
      uStack_e78 = local_1000._8_8_;
      uStack_e70 = local_1000._16_8_;
      uStack_e68 = local_1000._24_8_;
      local_fa0 = vsubps_avx(auVar5,local_1000);
      local_c20 = local_fa0;
      local_c10 = ::_ps256_cephes_exp_C1;
      local_720 = local_fa0._0_8_;
      uStack_718 = local_fa0._8_8_;
      uStack_710 = local_fa0._16_8_;
      uStack_708 = local_fa0._24_8_;
      local_740[0] = 0.6933594;
      local_740[1] = 0.6933594;
      afStack_738[0] = 0.6933594;
      afStack_738[1] = 0.6933594;
      afStack_730[0] = 0.6933594;
      afStack_730[1] = 0.6933594;
      afStack_728[0] = 0.6933594;
      afStack_728[1] = 0.6933594;
      local_760 = local_f60._0_8_;
      uStack_758 = local_f60._8_8_;
      uStack_750 = local_f60._16_8_;
      uStack_748 = local_f60._24_8_;
      auVar21._8_4_ = 0.6933594;
      auVar21._12_4_ = 0.6933594;
      auVar21._0_4_ = 0.6933594;
      auVar21._4_4_ = 0.6933594;
      auVar21._16_4_ = 0.6933594;
      auVar21._20_4_ = 0.6933594;
      auVar21._24_4_ = 0.6933594;
      auVar21._28_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar21,local_fa0,auVar4);
      local_c28 = ::_ps256_cephes_exp_C2;
      local_6c0 = local_fa0._0_8_;
      uStack_6b8 = local_fa0._8_8_;
      uStack_6b0 = local_fa0._16_8_;
      uStack_6a8 = local_fa0._24_8_;
      local_6e0[0] = -0.00021219444;
      local_6e0[1] = -0.00021219444;
      afStack_6d8[0] = -0.00021219444;
      afStack_6d8[1] = -0.00021219444;
      afStack_6d0[0] = -0.00021219444;
      afStack_6d0[1] = -0.00021219444;
      afStack_6c8[0] = -0.00021219444;
      afStack_6c8[1] = -0.00021219444;
      local_f60._0_8_ = auVar2._0_8_;
      local_700 = local_f60._0_8_;
      local_f60._8_8_ = auVar2._8_8_;
      uStack_6f8 = local_f60._8_8_;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      auVar22._8_4_ = -0.00021219444;
      auVar22._12_4_ = -0.00021219444;
      auVar22._0_4_ = -0.00021219444;
      auVar22._4_4_ = -0.00021219444;
      auVar22._16_4_ = -0.00021219444;
      auVar22._20_4_ = -0.00021219444;
      auVar22._24_4_ = -0.00021219444;
      auVar22._28_4_ = -0.00021219444;
      auVar2 = vfnmadd213ps_fma(auVar22,local_fa0,ZEXT1632(auVar2));
      auVar43 = ZEXT1632(auVar2);
      local_f60._0_8_ = auVar2._0_8_;
      local_f00 = local_f60._0_8_;
      local_f60._8_8_ = auVar2._8_8_;
      uStack_ef8 = local_f60._8_8_;
      uStack_ef0 = 0;
      uStack_ee8 = 0;
      local_ee0._0_4_ = auVar2._0_4_;
      local_ee0._4_4_ = auVar2._4_4_;
      uStack_ed8._0_4_ = auVar2._8_4_;
      uStack_ed8._4_4_ = auVar2._12_4_;
      local_f80._4_4_ = local_ee0._4_4_ * local_ee0._4_4_;
      local_f80._0_4_ = (float)local_ee0 * (float)local_ee0;
      local_7a0 = local_f80;
      uStack_f78._0_4_ = (float)uStack_ed8 * (float)uStack_ed8;
      uStack_f78._4_4_ = uStack_ed8._4_4_ * uStack_ed8._4_4_;
      auVar1 = _local_f80;
      _local_f80 = ZEXT1632(_local_f80);
      auVar12 = _local_f80;
      uStack_1018 = 0x3950696739506967;
      local_1020 = (undefined1  [8])0x3950696739506967;
      uStack_1010 = 0x3950696739506967;
      uStack_1008 = 0x3950696739506967;
      local_d18 = local_1020;
      local_cb0 = ::_ps256_cephes_exp_p1;
      local_960 = 0x3950696739506967;
      uStack_958 = 0x3950696739506967;
      uStack_950 = 0x3950696739506967;
      uStack_948 = 0x3950696739506967;
      local_980 = local_f60._0_8_;
      uStack_978 = local_f60._8_8_;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0[0] = 0.0013981999;
      local_9a0[1] = 0.0013981999;
      afStack_998[0] = 0.0013981999;
      afStack_998[1] = 0.0013981999;
      afStack_990[0] = 0.0013981999;
      afStack_990[1] = 0.0013981999;
      afStack_988[0] = 0.0013981999;
      afStack_988[1] = 0.0013981999;
      auVar16._8_4_ = 0.0013981999;
      auVar16._12_4_ = 0.0013981999;
      auVar16._0_4_ = 0.0013981999;
      auVar16._4_4_ = 0.0013981999;
      auVar16._16_4_ = 0.0013981999;
      auVar16._20_4_ = 0.0013981999;
      auVar16._24_4_ = 0.0013981999;
      auVar16._28_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(auVar43,_local_1020,auVar16);
      local_cc8 = ::_ps256_cephes_exp_p2;
      local_1020 = auVar2._0_8_;
      local_900 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uStack_8f8 = uStack_1018;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      local_920 = local_f60._0_8_;
      uStack_918 = local_f60._8_8_;
      uStack_910 = 0;
      uStack_908 = 0;
      local_940[0] = 0.008333452;
      local_940[1] = 0.008333452;
      afStack_938[0] = 0.008333452;
      afStack_938[1] = 0.008333452;
      afStack_930[0] = 0.008333452;
      afStack_930[1] = 0.008333452;
      afStack_928[0] = 0.008333452;
      afStack_928[1] = 0.008333452;
      auVar17._8_4_ = 0.008333452;
      auVar17._12_4_ = 0.008333452;
      auVar17._0_4_ = 0.008333452;
      auVar17._4_4_ = 0.008333452;
      auVar17._16_4_ = 0.008333452;
      auVar17._20_4_ = 0.008333452;
      auVar17._24_4_ = 0.008333452;
      auVar17._28_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar2),auVar17);
      local_ce0 = ::_ps256_cephes_exp_p3;
      local_1020 = auVar2._0_8_;
      local_8a0 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uStack_898 = uStack_1018;
      uStack_890 = 0;
      uStack_888 = 0;
      local_8c0 = local_f60._0_8_;
      uStack_8b8 = local_f60._8_8_;
      uStack_8b0 = 0;
      uStack_8a8 = 0;
      local_8e0[0] = 0.041665796;
      local_8e0[1] = 0.041665796;
      afStack_8d8[0] = 0.041665796;
      afStack_8d8[1] = 0.041665796;
      afStack_8d0[0] = 0.041665796;
      afStack_8d0[1] = 0.041665796;
      afStack_8c8[0] = 0.041665796;
      afStack_8c8[1] = 0.041665796;
      auVar18._8_4_ = 0.041665796;
      auVar18._12_4_ = 0.041665796;
      auVar18._0_4_ = 0.041665796;
      auVar18._4_4_ = 0.041665796;
      auVar18._16_4_ = 0.041665796;
      auVar18._20_4_ = 0.041665796;
      auVar18._24_4_ = 0.041665796;
      auVar18._28_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar2),auVar18);
      local_cf8 = ::_ps256_cephes_exp_p4;
      local_1020 = auVar2._0_8_;
      local_840 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uStack_838 = uStack_1018;
      uStack_830 = 0;
      uStack_828 = 0;
      local_860 = local_f60._0_8_;
      uStack_858 = local_f60._8_8_;
      uStack_850 = 0;
      uStack_848 = 0;
      local_880[0] = 0.16666666;
      local_880[1] = 0.16666666;
      afStack_878[0] = 0.16666666;
      afStack_878[1] = 0.16666666;
      afStack_870[0] = 0.16666666;
      afStack_870[1] = 0.16666666;
      afStack_868[0] = 0.16666666;
      afStack_868[1] = 0.16666666;
      auVar19._8_4_ = 0.16666666;
      auVar19._12_4_ = 0.16666666;
      auVar19._0_4_ = 0.16666666;
      auVar19._4_4_ = 0.16666666;
      auVar19._16_4_ = 0.16666666;
      auVar19._20_4_ = 0.16666666;
      auVar19._24_4_ = 0.16666666;
      auVar19._28_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar2),auVar19);
      local_d10 = ::_ps256_cephes_exp_p5;
      local_1020 = auVar2._0_8_;
      local_7e0 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uStack_7d8 = uStack_1018;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      local_800 = local_f60._0_8_;
      uStack_7f8 = local_f60._8_8_;
      uStack_7f0 = 0;
      uStack_7e8 = 0;
      local_820[0] = 0.5;
      local_820[1] = 0.5;
      afStack_818[0] = 0.5;
      afStack_818[1] = 0.5;
      afStack_810[0] = 0.5;
      afStack_810[1] = 0.5;
      afStack_808[0] = 0.5;
      afStack_808[1] = 0.5;
      auVar20._8_4_ = 0.5;
      auVar20._12_4_ = 0.5;
      auVar20._0_4_ = 0.5;
      auVar20._4_4_ = 0.5;
      auVar20._16_4_ = 0.5;
      auVar20._20_4_ = 0.5;
      auVar20._24_4_ = 0.5;
      auVar20._28_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar2),auVar20);
      local_d20 = local_f80;
      local_1020 = auVar2._0_8_;
      local_780 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uStack_778 = uStack_1018;
      uStack_770 = 0;
      uStack_768 = 0;
      uStack_f78 = auVar1._8_8_;
      uStack_798 = uStack_f78;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = local_f60._0_8_;
      uStack_7b8 = local_f60._8_8_;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      auVar2 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar2),auVar43);
      local_1020 = auVar2._0_8_;
      uVar9 = local_1020;
      uStack_1018 = auVar2._8_8_;
      uVar10 = uStack_1018;
      uStack_e90 = 0;
      uStack_e88 = 0;
      local_ec0 = 0x3f8000003f800000;
      uStack_eb8 = 0x3f8000003f800000;
      uStack_eb0 = 0x3f8000003f800000;
      uStack_ea8 = 0x3f8000003f800000;
      local_ea0._0_4_ = auVar2._0_4_;
      local_ea0._4_4_ = auVar2._4_4_;
      uStack_e98._0_4_ = auVar2._8_4_;
      uStack_e98._4_4_ = auVar2._12_4_;
      local_1020._4_4_ = local_ea0._4_4_ + 1.0;
      local_1020._0_4_ = (float)local_ea0 + 1.0;
      uStack_1018._0_4_ = (float)uStack_e98 + 1.0;
      uStack_1018._4_4_ = uStack_e98._4_4_ + 1.0;
      uStack_1010._0_4_ = 0x3f800000;
      uStack_1010._4_4_ = 0x3f800000;
      auVar41 = _local_1020;
      uStack_1008._0_4_ = 0x3f800000;
      uStack_1008._4_4_ = 0x3f800000;
      auVar6 = _local_1020;
      local_c00._0_4_ = local_fa0._0_4_;
      local_c00._4_4_ = local_fa0._4_4_;
      uStack_bf8._0_4_ = local_fa0._8_4_;
      uStack_bf8._4_4_ = local_fa0._12_4_;
      uStack_bf0._0_4_ = local_fa0._16_4_;
      uStack_bf0._4_4_ = local_fa0._20_4_;
      uStack_be8._0_4_ = local_fa0._24_4_;
      uStack_be8._4_4_ = local_fa0._28_4_;
      local_fc0 = CONCAT44((int)local_c00._4_4_,(int)(float)local_c00);
      uStack_fb8 = CONCAT44((int)uStack_bf8._4_4_,(int)(float)uStack_bf8);
      uStack_fb0 = CONCAT44((int)uStack_bf0._4_4_,(int)(float)uStack_bf0);
      uStack_fa8 = CONCAT44((int)uStack_be8._4_4_,(int)(float)uStack_be8);
      local_b00 = local_fc0;
      uStack_af8 = uStack_fb8;
      uStack_af0 = uStack_fb0;
      uStack_ae8 = uStack_fa8;
      local_b20 = 0x7f0000007f;
      uStack_b18 = 0x7f0000007f;
      uStack_b10 = 0x7f0000007f;
      uStack_b08 = 0x7f0000007f;
      local_ba0 = local_fc0;
      uStack_b98 = uStack_fb8;
      uStack_b90 = uStack_fb0;
      uStack_b88 = uStack_fa8;
      local_bc0 = 0x7f0000007f;
      uStack_bb8 = 0x7f0000007f;
      uStack_bb0 = 0x7f0000007f;
      uStack_ba8 = 0x7f0000007f;
      local_b50 = 0x7f0000007f;
      uStack_b48 = 0x7f0000007f;
      local_b60 = 0x7f0000007f;
      uStack_b58 = 0x7f0000007f;
      local_660 = local_fc0;
      uStack_658 = uStack_fb8;
      local_670 = 0x7f0000007f;
      uStack_668 = 0x7f0000007f;
      auVar23._8_8_ = uStack_fb8;
      auVar23._0_8_ = local_fc0;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_b30 = vpaddd_avx(auVar23,auVar3);
      local_680 = uStack_fb0;
      uStack_678 = uStack_fa8;
      local_690 = 0x7f0000007f;
      uStack_688 = 0x7f0000007f;
      auVar1._8_8_ = uStack_fa8;
      auVar1._0_8_ = uStack_fb0;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_b40 = vpaddd_avx(auVar1,auVar2);
      local_be0 = local_b30._0_8_;
      uStack_bd8 = local_b30._8_8_;
      uStack_bd0 = local_b40._0_8_;
      uStack_bc8 = local_b40._8_8_;
      local_b80 = local_b30._0_8_;
      uStack_b78 = local_b30._8_8_;
      uStack_b70 = local_b40._0_8_;
      uStack_b68 = local_b40._8_8_;
      local_a40 = local_b30._0_8_;
      uStack_a38 = local_b30._8_8_;
      uStack_a30 = local_b40._0_8_;
      uStack_a28 = local_b40._8_8_;
      local_a44 = 0x17;
      local_ac0 = local_b30._0_8_;
      uStack_ab8 = local_b30._8_8_;
      uStack_ab0 = local_b40._0_8_;
      uStack_aa8 = local_b40._8_8_;
      local_620 = local_b30._0_8_;
      uStack_618 = local_b30._8_8_;
      local_624 = 0x17;
      local_a60 = vpslld_avx(local_b30,ZEXT416(0x17));
      local_640 = local_b40._0_8_;
      uStack_638 = local_b40._8_8_;
      local_644 = 0x17;
      local_a70 = vpslld_avx(local_b40,ZEXT416(0x17));
      local_ae0 = local_a60._0_8_;
      uStack_ad8 = local_a60._8_8_;
      uStack_ad0 = local_a70._0_8_;
      uStack_ac8 = local_a70._8_8_;
      local_aa0 = local_a60._0_8_;
      uStack_a98 = local_a60._8_8_;
      uStack_a90 = local_a70._0_8_;
      uStack_a88 = local_a70._8_8_;
      local_fc0 = local_a60._0_8_;
      uStack_fb8 = local_a60._8_8_;
      uStack_fb0 = local_a70._0_8_;
      uStack_fa8 = local_a70._8_8_;
      local_a20 = local_a60._0_8_;
      uStack_a18 = local_a60._8_8_;
      uStack_a10 = local_a70._0_8_;
      uStack_a08 = local_a70._8_8_;
      local_1040 = local_a60._0_8_;
      uStack_1038 = local_a60._8_8_;
      uStack_1030 = local_a70._0_8_;
      uStack_1028 = local_a70._8_8_;
      local_f20 = local_1020;
      uStack_f18 = uStack_1018;
      uStack_1010 = auVar41._16_8_;
      uStack_f10 = uStack_1010;
      uStack_1008 = auVar6._24_8_;
      uStack_f08 = uStack_1008;
      local_f40._0_4_ = local_a60._0_4_;
      local_f40._4_4_ = local_a60._4_4_;
      uStack_f38._0_4_ = local_a60._8_4_;
      uStack_f38._4_4_ = local_a60._12_4_;
      uStack_f30._0_4_ = local_a70._0_4_;
      uStack_f30._4_4_ = local_a70._4_4_;
      uStack_f28._0_4_ = local_a70._8_4_;
      local_1020._0_4_ = ((float)local_ea0 + 1.0) * (float)local_f40;
      local_1020._4_4_ = (local_ea0._4_4_ + 1.0) * local_f40._4_4_;
      uStack_f38._0_4_ = ((float)uStack_e98 + 1.0) * (float)uStack_f38;
      uStack_f38._4_4_ = (uStack_e98._4_4_ + 1.0) * uStack_f38._4_4_;
      uStack_1018._0_4_ = (float)uStack_f38;
      uStack_1018._4_4_ = uStack_f38._4_4_;
      uStack_1010._0_4_ = (float)uStack_f30 * 1.0;
      uStack_1010._4_4_ = uStack_f30._4_4_ * 1.0;
      auVar41 = _local_1020;
      uStack_1008._0_4_ = (float)uStack_f28 * 1.0;
      uStack_1008._4_4_ = 0x3f800000;
      auVar11 = _local_1020;
      local_1080 = local_1020;
      uStack_1078 = uStack_1018;
      uStack_1010 = auVar41._16_8_;
      uStack_1070 = uStack_1010;
      uStack_1008 = auVar11._24_8_;
      uStack_1068 = uStack_1008;
      local_1060._0_4_ = local_1180._0_4_;
      local_1060._4_4_ = local_1180._4_4_;
      uStack_1058._0_4_ = local_1180._8_4_;
      uStack_1058._4_4_ = local_1180._12_4_;
      uStack_1050._0_4_ = auStack_1170._0_4_;
      uStack_1050._4_4_ = auStack_1170._4_4_;
      uStack_1048._0_4_ = auStack_1170._8_4_;
      uStack_1048._4_4_ = auStack_1170._12_4_;
      local_10c0 = (float)local_1060 + (float)local_1020._0_4_;
      fStack_10bc = local_1060._4_4_ + (float)local_1020._4_4_;
      fStack_10b8 = (float)uStack_1058 + (float)uStack_f38;
      fStack_10b4 = uStack_1058._4_4_ + uStack_f38._4_4_;
      fStack_10b0 = (float)uStack_1050 + (float)uStack_f30 * 1.0;
      fStack_10ac = uStack_1050._4_4_ + uStack_f30._4_4_ * 1.0;
      fStack_10a8 = (float)uStack_1048 + (float)uStack_f28 * 1.0;
      fStack_10a4 = uStack_1048._4_4_ + 1.0;
      auVar5._16_8_ = auStack_1170._0_8_;
      auVar5._0_16_ = local_1180;
      auVar5._24_8_ = auStack_1170._8_8_;
      auVar4._4_4_ = fStack_10bc;
      auVar4._0_4_ = local_10c0;
      auVar4._8_4_ = fStack_10b8;
      auVar4._12_4_ = fStack_10b4;
      auVar4._16_4_ = fStack_10b0;
      auVar4._20_4_ = fStack_10ac;
      auVar4._24_4_ = fStack_10a8;
      auVar4._28_4_ = fStack_10a4;
      local_1240 = vdivps_avx(auVar5,auVar4);
      local_1260 = local_1100._0_8_;
      uStack_1258 = local_1100._8_8_;
      uStack_1250 = auStack_10f0._0_8_;
      uStack_1248 = auStack_10f0._8_8_;
      auVar6._16_8_ = auStack_10f0._0_8_;
      auVar6._0_16_ = local_1100;
      auVar6._24_8_ = auStack_10f0._8_8_;
      local_1280._0_4_ = local_1140._0_4_;
      local_1280._4_4_ = local_1140._4_4_;
      uStack_1278._0_4_ = local_1140._8_4_;
      uStack_1278._4_4_ = local_1140._12_4_;
      uStack_1270._0_4_ = auStack_1130._0_4_;
      uStack_1270._4_4_ = auStack_1130._4_4_;
      uStack_1268._0_4_ = auStack_1130._8_4_;
      uStack_1268._4_4_ = auStack_1130._12_4_;
      auVar46._0_4_ = (uint)local_1280 ^ (uint)DAT_01fd2fa0;
      auVar46._4_4_ = local_1280._4_4_ ^ DAT_01fd2fa0._4_4_;
      auVar46._8_4_ = (uint)uStack_1278 ^ DAT_01fd2fa0._8_4_;
      auVar46._12_4_ = uStack_1278._4_4_ ^ DAT_01fd2fa0._12_4_;
      auVar46._16_4_ = (uint)uStack_1270 ^ DAT_01fd2fa0._16_4_;
      auVar46._20_4_ = uStack_1270._4_4_ ^ DAT_01fd2fa0._20_4_;
      auVar46._24_4_ = (uint)uStack_1268 ^ DAT_01fd2fa0._24_4_;
      auVar46._28_4_ = uStack_1268._4_4_ ^ DAT_01fd2fa0._28_4_;
      auVar2 = vfmadd213ps_fma(auVar6,local_1240,auVar46);
      local_1370 = local_1480;
      local_1500 = auVar2._0_8_;
      local_13a0 = local_1500;
      uStack_14f8 = auVar2._8_8_;
      uStack_1398 = uStack_14f8;
      uStack_1390 = 0;
      uStack_1388 = 0;
      *local_1480 = ZEXT1632(auVar2);
      local_1480 = local_1480 + 1;
      local_1280 = local_1140._0_8_;
      uStack_1278 = local_1140._8_8_;
      uStack_1270 = auStack_1130._0_8_;
      uStack_1268 = auStack_1130._8_8_;
      local_11c0 = local_1100._0_8_;
      uStack_11b8 = local_1100._8_8_;
      uStack_11b0 = auStack_10f0._0_8_;
      uStack_11a8 = auStack_10f0._8_8_;
      local_11a0 = uVar7;
      uStack_1198 = uVar8;
      uStack_1190 = uStack_14f0;
      uStack_1188 = uStack_13a8;
      local_115c = local_1160;
      local_1158 = local_1160;
      local_1154 = local_1160;
      local_1150 = local_1160;
      local_114c = local_1160;
      local_1148 = local_1160;
      local_1144 = local_1160;
      local_111c = local_1120;
      local_1118 = local_1120;
      local_1114 = local_1120;
      local_1110 = local_1120;
      local_110c = local_1120;
      local_1108 = local_1120;
      local_1104 = local_1120;
      local_10dc = local_10e0;
      local_10d8 = local_10e0;
      local_10d4 = local_10e0;
      local_10d0 = local_10e0;
      local_10cc = local_10e0;
      local_10c8 = local_10e0;
      local_10c4 = local_10e0;
      local_1060 = local_10a0;
      uStack_1058 = uStack_1098;
      uStack_1050 = uStack_1090;
      uStack_1048 = uStack_1088;
      _local_1020 = auVar11;
      _local_f80 = auVar12;
      local_f60 = auVar43;
      local_f40 = local_a60._0_8_;
      uStack_f38 = local_a60._8_8_;
      uStack_f30 = local_a70._0_8_;
      uStack_f28 = local_a70._8_8_;
      local_ee0 = local_f00;
      uStack_ed8 = uStack_ef8;
      uStack_ed0 = uStack_ef0;
      uStack_ec8 = uStack_ee8;
      local_ea0 = uVar9;
      uStack_e98 = uVar10;
      local_de0 = local_e00;
      local_d08 = local_d28;
      local_d00 = local_d18;
      local_cf0 = local_d28;
      local_ce8 = local_d18;
      local_cd8 = local_d28;
      local_cd0 = local_d18;
      local_cc0 = local_d28;
      local_cb8 = local_d18;
      local_ca8 = local_d28;
      local_ca0 = local_d18;
      local_c88 = local_d28;
      local_c30 = local_d28;
      local_c18 = local_d28;
      local_c08 = local_c20;
      local_c00 = local_fa0._0_8_;
      uStack_bf8 = local_fa0._8_8_;
      uStack_bf0 = local_fa0._16_8_;
      uStack_be8 = local_fa0._24_8_;
    }
    for (; local_12b8 = local_1418, local_14a8 = local_1318, local_14d8 + 3 < local_1470;
        local_14d8 = local_14d8 + 4) {
      local_1368 = local_1480;
      local_1340 = *(undefined8 *)*local_1480;
      uStack_1338 = *(undefined8 *)(*local_1480 + 8);
      local_5d4 = 0x3f800000;
      local_5f0 = 0x3f800000;
      local_1350 = 0x3f8000003f800000;
      uStack_1348 = 0x3f8000003f800000;
      local_5f4 = 0x40000000;
      local_610 = 0x40000000;
      local_1360 = 0x4000000040000000;
      uStack_1358 = 0x4000000040000000;
      local_580._0_4_ = (float)local_1340;
      local_580._4_4_ = (float)((ulong)local_1340 >> 0x20);
      uStack_578._0_4_ = (float)uStack_1338;
      uStack_578._4_4_ = (float)((ulong)uStack_1338 >> 0x20);
      local_560 = (float)local_580 * 2.0;
      fStack_55c = local_580._4_4_ * 2.0;
      fStack_558 = (float)uStack_578 * 2.0;
      fStack_554 = uStack_578._4_4_ * 2.0;
      local_534 = 0x3f800000;
      local_550 = 0x3f800000;
      local_570 = 0x3f8000003f800000;
      uStack_568 = 0x3f8000003f800000;
      local_500._8_8_ = 0x3f8000003f800000;
      local_500._0_8_ = 0x3f8000003f800000;
      local_350 = ZEXT816(0) << 0x20;
      local_520 = 0;
      local_340._8_8_ = SUB168(ZEXT816(0),4);
      uStack_518 = local_340._8_8_;
      local_530 = CONCAT44(fStack_55c,local_560);
      uStack_528 = CONCAT44(fStack_554,fStack_558);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_340._8_8_;
      auVar25._8_8_ = uStack_528;
      auVar25._0_8_ = local_530;
      auVar2 = vsubps_avx(auVar42 << 0x40,auVar25);
      local_4a0 = 0x3f8000003f800000;
      uStack_498 = 0x3f8000003f800000;
      local_460._0_8_ = auVar2._0_8_;
      local_320 = local_460._0_8_;
      local_460._8_8_ = auVar2._8_8_;
      uStack_318 = local_460._8_8_;
      local_330 = 0x42b0c0a542b0c0a5;
      uStack_328 = 0x42b0c0a542b0c0a5;
      auVar29._8_8_ = 0x42b0c0a542b0c0a5;
      auVar29._0_8_ = 0x42b0c0a542b0c0a5;
      auVar2 = vminps_avx(auVar2,auVar29);
      local_460._0_8_ = auVar2._0_8_;
      local_300 = local_460._0_8_;
      local_460._8_8_ = auVar2._8_8_;
      uStack_2f8 = local_460._8_8_;
      local_310 = 0xc2b0c0a5c2b0c0a5;
      uStack_308 = 0xc2b0c0a5c2b0c0a5;
      auVar30._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar2,auVar30);
      local_460._0_8_ = auVar3._0_8_;
      uVar7 = local_460._0_8_;
      local_460._8_8_ = auVar3._8_8_;
      uVar8 = local_460._8_8_;
      local_3b0 = 0x3fb8aa3b3fb8aa3b;
      uStack_3a8 = 0x3fb8aa3b3fb8aa3b;
      local_3a0._0_4_ = auVar3._0_4_;
      local_3a0._4_4_ = auVar3._4_4_;
      uStack_398._0_4_ = auVar3._8_4_;
      uStack_398._4_4_ = auVar3._12_4_;
      local_480._4_4_ = local_3a0._4_4_ * 1.442695;
      local_480._0_4_ = (float)local_3a0 * 1.442695;
      uStack_478._0_4_ = (float)uStack_398 * 1.442695;
      uStack_478._4_4_ = uStack_398._4_4_ * 1.442695;
      local_360 = local_480;
      uStack_358 = uStack_478;
      local_370 = 0x3f0000003f000000;
      uStack_368 = 0x3f0000003f000000;
      local_480._0_4_ = (float)local_3a0 * 1.442695 + 0.5;
      local_480._4_4_ = local_3a0._4_4_ * 1.442695 + 0.5;
      fVar44 = (float)uStack_398 * 1.442695 + 0.5;
      fVar45 = uStack_398._4_4_ * 1.442695 + 0.5;
      uStack_478._0_4_ = fVar44;
      uStack_478._4_4_ = fVar45;
      local_2e0 = local_480;
      uStack_2d8 = uStack_478;
      local_490._4_4_ = (int)(float)local_480._4_4_;
      local_490._0_4_ = (int)(float)local_480._0_4_;
      local_490._8_4_ = (int)fVar44;
      local_490._12_4_ = (int)fVar45;
      local_2d0 = local_490._0_8_;
      uStack_2c8 = local_490._8_8_;
      auVar31._8_8_ = local_490._8_8_;
      auVar31._0_8_ = local_490._0_8_;
      auVar1 = vcvtdq2ps_avx(auVar31);
      local_470 = auVar1._0_8_;
      local_2b0 = local_470;
      uStack_468 = auVar1._8_8_;
      uStack_2a8 = uStack_468;
      local_2c0 = local_480;
      uStack_2b8 = uStack_478;
      auVar32._8_8_ = uStack_478;
      auVar32._0_8_ = local_480;
      auVar2 = vcmpps_avx(auVar32,auVar1,1);
      local_4b0._0_8_ = auVar2._0_8_;
      local_290 = local_4b0._0_8_;
      local_4b0._8_8_ = auVar2._8_8_;
      uStack_288 = local_4b0._8_8_;
      local_2a0 = 0x3f8000003f800000;
      uStack_298 = 0x3f8000003f800000;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      local_4b0 = vpand_avx(auVar2,auVar33);
      local_400 = local_470;
      uStack_3f8 = uStack_468;
      local_410 = local_4b0._0_8_;
      uStack_408 = local_4b0._8_8_;
      _local_480 = vsubps_avx(auVar1,local_4b0);
      local_270 = local_480;
      local_260 = ::_ps_cephes_exp_C1;
      local_280 = local_460;
      local_190 = local_480;
      uStack_188 = uStack_478;
      local_1a0[0] = 0.6933594;
      local_1a0[1] = 0.6933594;
      afStack_198[0] = 0.6933594;
      afStack_198[1] = 0.6933594;
      local_1b0 = local_460._0_8_;
      uStack_1a8 = local_460._8_8_;
      auVar34._8_4_ = 0.6933594;
      auVar34._12_4_ = 0.6933594;
      auVar34._0_4_ = 0.6933594;
      auVar34._4_4_ = 0.6933594;
      auVar2 = vfnmadd213ps_fma(auVar34,_local_480,auVar3);
      local_278 = ::_ps_cephes_exp_C2;
      local_160 = local_480;
      uStack_158 = uStack_478;
      local_170[0] = -0.00021219444;
      local_170[1] = -0.00021219444;
      afStack_168[0] = -0.00021219444;
      afStack_168[1] = -0.00021219444;
      local_460._0_8_ = auVar2._0_8_;
      local_180 = local_460._0_8_;
      local_460._8_8_ = auVar2._8_8_;
      uStack_178 = local_460._8_8_;
      auVar35._8_4_ = -0.00021219444;
      auVar35._12_4_ = -0.00021219444;
      auVar35._0_4_ = -0.00021219444;
      auVar35._4_4_ = -0.00021219444;
      local_460 = vfnmadd213ps_fma(auVar35,_local_480,auVar2);
      local_3d0 = local_460._0_8_;
      uStack_3c8 = local_460._8_8_;
      local_3c0._0_4_ = local_460._0_4_;
      local_3c0._4_4_ = local_460._4_4_;
      uStack_3b8._0_4_ = local_460._8_4_;
      uStack_3b8._4_4_ = local_460._12_4_;
      local_470._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
      local_470._0_4_ = (float)local_3c0 * (float)local_3c0;
      uStack_468._0_4_ = (float)uStack_3b8 * (float)uStack_3b8;
      uStack_468._4_4_ = uStack_3b8._4_4_ * uStack_3b8._4_4_;
      uStack_4b8 = 0x3950696739506967;
      local_4c0 = (undefined1  [8])0x3950696739506967;
      local_240 = local_4c0;
      local_1d8 = ::_ps_cephes_exp_p1;
      local_130 = 0x3950696739506967;
      uStack_128 = 0x3950696739506967;
      local_140 = local_460._0_8_;
      uStack_138 = local_460._8_8_;
      local_150[0] = 0.0013981999;
      local_150[1] = 0.0013981999;
      afStack_148[0] = 0.0013981999;
      afStack_148[1] = 0.0013981999;
      auVar36._8_4_ = 0.0013981999;
      auVar36._12_4_ = 0.0013981999;
      auVar36._0_4_ = 0.0013981999;
      auVar36._4_4_ = 0.0013981999;
      auVar2 = vfmadd213ps_fma(local_460,_local_4c0,auVar36);
      local_1f0 = ::_ps_cephes_exp_p2;
      local_4c0 = auVar2._0_8_;
      local_100 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uStack_f8 = uStack_4b8;
      local_110 = local_460._0_8_;
      uStack_108 = local_460._8_8_;
      local_120[0] = 0.008333452;
      local_120[1] = 0.008333452;
      afStack_118[0] = 0.008333452;
      afStack_118[1] = 0.008333452;
      auVar37._8_4_ = 0.008333452;
      auVar37._12_4_ = 0.008333452;
      auVar37._0_4_ = 0.008333452;
      auVar37._4_4_ = 0.008333452;
      auVar2 = vfmadd213ps_fma(local_460,auVar2,auVar37);
      local_208 = ::_ps_cephes_exp_p3;
      local_4c0 = auVar2._0_8_;
      local_d0 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uStack_c8 = uStack_4b8;
      local_e0 = local_460._0_8_;
      uStack_d8 = local_460._8_8_;
      local_f0[0] = 0.041665796;
      local_f0[1] = 0.041665796;
      afStack_e8[0] = 0.041665796;
      afStack_e8[1] = 0.041665796;
      auVar38._8_4_ = 0.041665796;
      auVar38._12_4_ = 0.041665796;
      auVar38._0_4_ = 0.041665796;
      auVar38._4_4_ = 0.041665796;
      auVar2 = vfmadd213ps_fma(local_460,auVar2,auVar38);
      local_220 = ::_ps_cephes_exp_p4;
      local_4c0 = auVar2._0_8_;
      local_a0 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uStack_98 = uStack_4b8;
      local_b0 = local_460._0_8_;
      uStack_a8 = local_460._8_8_;
      local_c0[0] = 0.16666666;
      local_c0[1] = 0.16666666;
      afStack_b8[0] = 0.16666666;
      afStack_b8[1] = 0.16666666;
      auVar39._8_4_ = 0.16666666;
      auVar39._12_4_ = 0.16666666;
      auVar39._0_4_ = 0.16666666;
      auVar39._4_4_ = 0.16666666;
      auVar2 = vfmadd213ps_fma(local_460,auVar2,auVar39);
      local_238 = ::_ps_cephes_exp_p5;
      local_4c0 = auVar2._0_8_;
      local_70 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uStack_68 = uStack_4b8;
      local_80 = local_460._0_8_;
      uStack_78 = local_460._8_8_;
      local_90[0] = 0.5;
      local_90[1] = 0.5;
      afStack_88[0] = 0.5;
      afStack_88[1] = 0.5;
      auVar40._8_4_ = 0.5;
      auVar40._12_4_ = 0.5;
      auVar40._0_4_ = 0.5;
      auVar40._4_4_ = 0.5;
      auVar2 = vfmadd213ps_fma(local_460,auVar2,auVar40);
      local_248 = local_470;
      local_4c0 = auVar2._0_8_;
      local_40 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uStack_38 = uStack_4b8;
      local_50 = local_470;
      uStack_48 = uStack_468;
      local_60 = local_460._0_8_;
      uStack_58 = local_460._8_8_;
      auVar2 = vfmadd213ps_fma(_local_470,auVar2,local_460);
      local_4c0 = auVar2._0_8_;
      uVar9 = local_4c0;
      uStack_4b8 = auVar2._8_8_;
      uVar10 = uStack_4b8;
      local_390 = 0x3f8000003f800000;
      uStack_388 = 0x3f8000003f800000;
      local_380._0_4_ = auVar2._0_4_;
      local_380._4_4_ = auVar2._4_4_;
      uStack_378._0_4_ = auVar2._8_4_;
      uStack_378._4_4_ = auVar2._12_4_;
      local_4c0._4_4_ = local_380._4_4_ + 1.0;
      local_4c0._0_4_ = (float)local_380 + 1.0;
      uStack_4b8._0_4_ = (float)uStack_378 + 1.0;
      uStack_4b8._4_4_ = uStack_378._4_4_ + 1.0;
      local_2f0._0_4_ = local_480._0_4_;
      local_2f0._4_4_ = local_480._4_4_;
      uStack_2e8._0_4_ = local_480._8_4_;
      uStack_2e8._4_4_ = local_480._12_4_;
      local_490._4_4_ = (int)local_2f0._4_4_;
      local_490._0_4_ = (int)(float)local_2f0;
      local_490._8_4_ = (int)(float)uStack_2e8;
      local_490._12_4_ = (int)uStack_2e8._4_4_;
      local_440 = local_490._0_8_;
      uStack_438 = local_490._8_8_;
      local_450 = 0x7f0000007f;
      uStack_448 = 0x7f0000007f;
      auVar28._8_8_ = local_490._8_8_;
      auVar28._0_8_ = local_490._0_8_;
      auVar27._8_8_ = 0x7f0000007f;
      auVar27._0_8_ = 0x7f0000007f;
      auVar2 = vpaddd_avx(auVar28,auVar27);
      local_490._0_8_ = auVar2._0_8_;
      local_420 = local_490._0_8_;
      local_490._8_8_ = auVar2._8_8_;
      uStack_418 = local_490._8_8_;
      local_424 = 0x17;
      local_490 = vpslld_avx(auVar2,ZEXT416(0x17));
      local_1c0 = local_490._0_8_;
      uStack_1b8 = local_490._8_8_;
      local_4d0 = local_490._0_8_;
      uStack_4c8 = local_490._8_8_;
      local_3e0 = _local_4c0;
      local_3f0._0_4_ = local_490._0_4_;
      local_3f0._4_4_ = local_490._4_4_;
      uStack_3e8._0_4_ = local_490._8_4_;
      uStack_3e8._4_4_ = local_490._12_4_;
      local_4c0._0_4_ = ((float)local_380 + 1.0) * (float)local_3f0;
      local_4c0._4_4_ = (local_380._4_4_ + 1.0) * local_3f0._4_4_;
      uStack_3e8._0_4_ = ((float)uStack_378 + 1.0) * (float)uStack_3e8;
      uStack_3e8._4_4_ = (uStack_378._4_4_ + 1.0) * uStack_3e8._4_4_;
      uStack_4b8._0_4_ = (float)uStack_3e8;
      uStack_4b8._4_4_ = uStack_3e8._4_4_;
      local_4f0 = local_4c0;
      uStack_4e8 = uStack_4b8;
      local_510 = (float)local_4c0._0_4_ + 1.0;
      fStack_50c = (float)local_4c0._4_4_ + 1.0;
      fStack_508 = (float)uStack_3e8 + 1.0;
      fStack_504 = uStack_3e8._4_4_ + 1.0;
      auVar26._4_4_ = fStack_50c;
      auVar26._0_4_ = local_510;
      auVar26._8_4_ = fStack_508;
      auVar26._12_4_ = fStack_504;
      _local_5a0 = vdivps_avx(local_500,auVar26);
      local_5c0._0_4_ = (float)local_5a0._0_4_ * 2.0;
      local_5c0._4_4_ = (float)local_5a0._4_4_ * 2.0;
      local_5c0._8_4_ = fStack_598 * 2.0;
      local_5c0._12_4_ = fStack_594 * 2.0;
      auVar24._8_8_ = 0x3f8000003f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(local_5c0,auVar24);
      local_1320 = local_1480;
      local_1510 = auVar2._0_8_;
      local_1330 = local_1510;
      uStack_1508 = auVar2._8_8_;
      uStack_1328 = uStack_1508;
      *(undefined1 (*) [16])*local_1480 = auVar2;
      local_1480 = (undefined1 (*) [32])(*local_1480 + 0x10);
      uStack_60c = local_610;
      uStack_608 = local_610;
      uStack_604 = local_610;
      uStack_5ec = local_5f0;
      uStack_5e8 = local_5f0;
      uStack_5e4 = local_5f0;
      local_5d0 = local_1350;
      uStack_5c8 = uStack_1348;
      local_5b0 = local_1360;
      uStack_5a8 = uStack_1358;
      local_590 = local_1360;
      uStack_588 = uStack_1358;
      local_580 = local_1340;
      uStack_578 = uStack_1338;
      uStack_54c = local_550;
      uStack_548 = local_550;
      uStack_544 = local_550;
      local_4e0 = local_500;
      local_3f0 = local_490._0_8_;
      uStack_3e8 = local_490._8_8_;
      local_3c0 = local_3d0;
      uStack_3b8 = uStack_3c8;
      local_3a0 = uVar7;
      uStack_398 = uVar8;
      local_380 = uVar9;
      uStack_378 = uVar10;
      local_340 = local_350;
      local_2f0 = local_480;
      uStack_2e8 = uStack_478;
      local_268 = local_280;
      local_258 = local_270;
      local_250 = local_280;
      local_230 = local_280;
      local_228 = local_240;
      local_218 = local_280;
      local_210 = local_240;
      local_200 = local_280;
      local_1f8 = local_240;
      local_1e8 = local_280;
      local_1e0 = local_240;
      local_1d0 = local_280;
      local_1c8 = local_240;
    }
    for (; local_14d8 < local_1470; local_14d8 = local_14d8 + 1) {
      fVar44 = tanhf(*(float *)*local_1480);
      *(float *)*local_1480 = fVar44;
      local_1480 = (undefined1 (*) [32])(*local_1480 + 4);
    }
  }
  return 0;
}

Assistant:

int TanH_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}